

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugUtils.cpp
# Opt level: O2

bool JsrtDebugUtils::HasProperty
               (DynamicObject *object,JsrtDebugPropertyId propertyId,ScriptContext *scriptContext)

{
  BOOL BVar1;
  char16 *string;
  size_t sVar2;
  bool bVar3;
  PropertyRecord *local_30;
  PropertyRecord *propertyRecord;
  
  string = GetDebugPropertyName(propertyId);
  sVar2 = PAL_wcslen(string);
  Js::ScriptContext::FindPropertyRecord(scriptContext,string,(int)sVar2,&local_30);
  if (local_30 == (PropertyRecord *)0x0) {
    bVar3 = false;
  }
  else {
    BVar1 = Js::JavascriptOperators::HasProperty(&object->super_RecyclableObject,local_30->pid);
    bVar3 = BVar1 != 0;
  }
  return bVar3;
}

Assistant:

bool JsrtDebugUtils::HasProperty(Js::DynamicObject * object, JsrtDebugPropertyId propertyId, Js::ScriptContext * scriptContext)
{
    const char16* propertyName = GetDebugPropertyName(propertyId);

    const Js::PropertyRecord* propertyRecord;
    scriptContext->FindPropertyRecord(propertyName, static_cast<int>(wcslen(propertyName)), &propertyRecord);

    if (propertyRecord == nullptr)
    {
        // No property record exists, there must be no property with that name in the script context.
        return false;
    }

    return !!Js::JavascriptOperators::HasProperty(object, propertyRecord->GetPropertyId());
}